

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_2> tcu::operator*(Matrix<float,_2,_1> *a,Matrix<float,_1,_2> *b)

{
  float fVar1;
  long lVar2;
  Matrix<float,_2,_2> *res;
  undefined8 *in_RDI;
  int col_1;
  undefined8 *puVar3;
  int col;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar2 = 0;
  puVar3 = in_RDI;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar6 = 0;
      }
      *(undefined4 *)(puVar3 + lVar4) = uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  lVar2 = 0;
  do {
    fVar1 = (a->m_data).m_data[0].m_data[lVar2];
    lVar4 = 0;
    do {
      *(float *)(in_RDI + lVar4) = (b->m_data).m_data[lVar4].m_data[0] * fVar1 + 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    in_RDI = (undefined8 *)((long)in_RDI + 4);
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  return (Vector<tcu::Vector<float,_2>,_2>)(ZEXT416((uint)fVar1) << 0x40);
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}